

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdNode * Cudd_VectorSupport(DdManager *dd,DdNode **F,int n)

{
  int *support_00;
  ulong uVar1;
  DdNode *g;
  DdNode *pDVar2;
  int local_5c;
  int local_58;
  int local_50;
  int size;
  int j;
  int i;
  DdNode *var;
  DdNode *tmp;
  DdNode *res;
  int *support;
  int n_local;
  DdNode **F_local;
  DdManager *dd_local;
  
  if (dd->size < dd->sizeZ) {
    local_58 = dd->sizeZ;
  }
  else {
    local_58 = dd->size;
  }
  support_00 = (int *)malloc((long)local_58 << 2);
  if (support_00 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local = (DdManager *)0x0;
  }
  else {
    for (size = 0; size < local_58; size = size + 1) {
      support_00[size] = 0;
    }
    for (size = 0; size < n; size = size + 1) {
      ddSupportStep((DdNode *)((ulong)F[size] & 0xfffffffffffffffe),support_00);
    }
    for (size = 0; size < n; size = size + 1) {
      ddClearFlag((DdNode *)((ulong)F[size] & 0xfffffffffffffffe));
    }
    tmp = dd->one;
    uVar1 = (ulong)tmp & 0xfffffffffffffffe;
    *(int *)(uVar1 + 4) = *(int *)(uVar1 + 4) + 1;
    while (local_50 = local_58 + -1, -1 < local_50) {
      if (local_50 < dd->size) {
        local_5c = dd->invperm[local_50];
      }
      else {
        local_5c = local_50;
      }
      local_58 = local_50;
      if (support_00[local_5c] == 1) {
        g = cuddUniqueInter(dd,local_5c,dd->one,(DdNode *)((ulong)dd->one ^ 1));
        *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
        pDVar2 = Cudd_bddAnd(dd,tmp,g);
        if (pDVar2 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,tmp);
          Cudd_RecursiveDeref(dd,g);
          if (support_00 != (int *)0x0) {
            free(support_00);
          }
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref(dd,tmp);
        Cudd_RecursiveDeref(dd,g);
        tmp = pDVar2;
      }
    }
    if (support_00 != (int *)0x0) {
      free(support_00);
    }
    *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)tmp & 0xfffffffffffffffe) + 4) + -1;
    dd_local = (DdManager *)tmp;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_VectorSupport(
  DdManager * dd /* manager */,
  DdNode ** F /* array of DDs whose support is sought */,
  int  n /* size of the array */)
{
    int *support;
    DdNode *res, *tmp, *var;
    int i,j;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    for (i = 0; i < n; i++) {
        ddSupportStep(Cudd_Regular(F[i]),support);
    }
    for (i = 0; i < n; i++) {
        ddClearFlag(Cudd_Regular(F[i]));
    }

    /* Transform support from array to cube. */
    res = DD_ONE(dd);
    cuddRef(res);
    for (j = size - 1; j >= 0; j--) { /* for each level bottom-up */
        i = (j >= dd->size) ? j : dd->invperm[j];
        if (support[i] == 1) {
            var = cuddUniqueInter(dd,i,dd->one,Cudd_Not(dd->one));
            cuddRef(var);
            tmp = Cudd_bddAnd(dd,res,var);
            if (tmp == NULL) {
                Cudd_RecursiveDeref(dd,res);
                Cudd_RecursiveDeref(dd,var);
                ABC_FREE(support);
                return(NULL);
            }
            cuddRef(tmp);
            Cudd_RecursiveDeref(dd,res);
            Cudd_RecursiveDeref(dd,var);
            res = tmp;
        }
    }

    ABC_FREE(support);
    cuddDeref(res);
    return(res);

}